

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptor.hpp
# Opt level: O0

iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
* burst::operator|(iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
                   *__return_storage_ptr__,
                  iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>
                  *range,adaptor_compare_forwarder_t<burst::symmetric_difference_t,_std::tuple<std::greater<void>_>_>
                         *forwarder)

{
  tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>_&&,_std::greater<void>_&&>
  *in_RCX;
  forward_tuple_fn local_38 [8];
  undefined1 local_30 [8];
  tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>_&&>
  local_28 [2];
  adaptor_compare_forwarder_t<burst::symmetric_difference_t,_std::tuple<std::greater<void>_>_>
  *local_18;
  adaptor_compare_forwarder_t<burst::symmetric_difference_t,_std::tuple<std::greater<void>_>_>
  *forwarder_local;
  iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  *range_local;
  
  local_18 = forwarder;
  forwarder_local =
       (adaptor_compare_forwarder_t<burst::symmetric_difference_t,_std::tuple<std::greater<void>_>_>
        *)range;
  std::
  forward_as_tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>>>
            ((iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>
              *)local_30);
  forward_tuple_fn::operator()(local_38,(tuple<std::greater<void>_> *)&forward_tuple);
  std::
  tuple_cat<std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>>&&>,std::tuple<std::greater<void>&&>,void>
            (local_28,(tuple<std::greater<void>_&&> *)local_30);
  apply<burst::symmetric_difference_t&,std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>>&&,std::greater<void>&&>>
            (__return_storage_ptr__,(burst *)forwarder,(symmetric_difference_t *)local_28,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto operator | (Range && range, adaptor_compare_forwarder_t<Adaptor, Tuple> forwarder)
    {
        return
            burst::apply
            (
                forwarder.adaptor,
                std::tuple_cat
                (
                    std::forward_as_tuple(std::forward<Range>(range)),
                    forward_tuple(std::move(forwarder.arguments))
                )
            );
    }